

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O0

optional<uint256> * node::ReadSnapshotBaseBlockhash(path *chaindir)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  bool bVar1;
  undefined1 uVar2;
  FILE *pFVar3;
  AutoFile *pAVar4;
  AutoFile *pAVar5;
  AutoFile *in_RSI;
  optional<uint256> *in_RDI;
  long in_FS_OFFSET;
  int64_t position;
  FILE *file;
  AutoFile afile;
  uint256 base_blockhash;
  string read_from_str;
  path read_from;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffd6c;
  char *in_stack_fffffffffffffd70;
  AutoFile *in_stack_fffffffffffffd78;
  path *in_stack_fffffffffffffd80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd88;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffda0;
  AutoFile *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  undefined8 in_stack_fffffffffffffdd8;
  int iVar7;
  undefined8 in_stack_fffffffffffffde0;
  int origin;
  ConstevalFormatString<1U> in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  size_t in_stack_fffffffffffffe30;
  char *pcVar8;
  char *in_stack_fffffffffffffe38;
  Level in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  AutoFile local_98;
  char local_50 [72];
  long local_8;
  
  origin = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  iVar7 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (bVar1) {
    iVar7 = (int)((ulong)&local_98.m_position >> 0x20);
    fs::path::path((path *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (path *)0x9532ba);
    fs::operator/(in_stack_fffffffffffffd80,(path *)in_stack_fffffffffffffd78);
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffd70);
    uVar2 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    if ((bool)uVar2) {
      uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      pFVar3 = fsbridge::fopen(local_50,"rb");
      std::vector<std::byte,_std::allocator<std::byte>_>::vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                         (FILE *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffd78);
      bVar1 = AutoFile::IsNull((AutoFile *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd68 = 2;
        logging_function_01._M_str = in_stack_fffffffffffffe38;
        logging_function_01._M_len = in_stack_fffffffffffffe30;
        source_file_01._M_str._0_4_ = in_stack_fffffffffffffe28;
        source_file_01._M_len = (size_t)pFVar3;
        source_file_01._M_str._4_4_ = in_stack_fffffffffffffe2c;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_01,source_file_01,iVar7,
                   CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_ffffffffffffff10,
                   (ConstevalFormatString<1U>)0x111f842,in_stack_ffffffffffffff20);
        std::optional<uint256>::optional(in_RDI);
      }
      else {
        AutoFile::operator>>(in_stack_fffffffffffffd78,(uint256 *)in_stack_fffffffffffffd70);
        pAVar4 = (AutoFile *)AutoFile::tell(in_stack_fffffffffffffda8);
        pAVar5 = pAVar4;
        AutoFile::seek(in_RSI,CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),origin);
        pAVar5 = (AutoFile *)AutoFile::tell(pAVar5);
        if (pAVar4 != pAVar5) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
          in_stack_fffffffffffffd78 = &local_98;
          in_stack_fffffffffffffd70 = "[snapshot] warning: unexpected trailing data in %s\n";
          in_stack_fffffffffffffd68 = 2;
          logging_function_02._M_str = in_stack_fffffffffffffe38;
          logging_function_02._M_len = in_stack_fffffffffffffe30;
          source_file_02._M_str._0_4_ = in_stack_fffffffffffffe28;
          source_file_02._M_len = (size_t)pFVar3;
          source_file_02._M_str._4_4_ = in_stack_fffffffffffffe2c;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_02,source_file_02,iVar7,
                     CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_ffffffffffffff10,
                     in_stack_fffffffffffffe18,in_stack_ffffffffffffff20);
        }
        std::optional<uint256>::optional<uint256,_true>
                  ((optional<uint256> *)in_stack_fffffffffffffd78,
                   (uint256 *)in_stack_fffffffffffffd70);
      }
      AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68))
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      pcVar8 = 
      "[snapshot] snapshot chainstate dir is malformed! no base blockhash file exists at path %s. Try deleting %s and calling loadtxoutset again?\n"
      ;
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffd70);
      in_stack_fffffffffffffd68 = 2;
      logging_function_00._M_str = in_stack_fffffffffffffe38;
      logging_function_00._M_len = (size_t)pcVar8;
      source_file_00._M_str._0_4_ = in_stack_fffffffffffffe28;
      source_file_00._M_len = in_stack_fffffffffffffe20;
      source_file_00._M_str._4_4_ = in_stack_fffffffffffffe2c;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function_00,source_file_00,iVar7,CONCAT17(uVar2,in_stack_fffffffffffffdd0),
                 in_stack_ffffffffffffff10,(ConstevalFormatString<2U>)in_stack_fffffffffffffe18.fmt,
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::optional<uint256>::optional(in_RDI);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffd70);
    uVar6 = 2;
    logging_function._M_str = in_stack_fffffffffffffe38;
    logging_function._M_len = in_stack_fffffffffffffe30;
    source_file._M_str._0_4_ = in_stack_fffffffffffffe28;
    source_file._M_len = in_stack_fffffffffffffe20;
    source_file._M_str._4_4_ = in_stack_fffffffffffffe2c;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,iVar7,
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_ffffffffffffff10,in_stack_fffffffffffffe18,in_stack_ffffffffffffff20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,uVar6));
    std::optional<uint256>::optional(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> ReadSnapshotBaseBlockhash(fs::path chaindir)
{
    if (!fs::exists(chaindir)) {
        LogPrintf("[snapshot] cannot read base blockhash: no chainstate dir "
            "exists at path %s\n", fs::PathToString(chaindir));
        return std::nullopt;
    }
    const fs::path read_from = chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;
    const std::string read_from_str = fs::PathToString(read_from);

    if (!fs::exists(read_from)) {
        LogPrintf("[snapshot] snapshot chainstate dir is malformed! no base blockhash file "
            "exists at path %s. Try deleting %s and calling loadtxoutset again?\n",
            fs::PathToString(chaindir), read_from_str);
        return std::nullopt;
    }

    uint256 base_blockhash;
    FILE* file{fsbridge::fopen(read_from, "rb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for reading: %s\n",
            read_from_str);
        return std::nullopt;
    }
    afile >> base_blockhash;

    int64_t position = afile.tell();
    afile.seek(0, SEEK_END);
    if (position != afile.tell()) {
        LogPrintf("[snapshot] warning: unexpected trailing data in %s\n", read_from_str);
    }
    return base_blockhash;
}